

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentAtomicCounterCase::iterate
          (ConcurrentAtomicCounterCase *this)

{
  int *value;
  int *value_00;
  ostringstream *poVar1;
  int iVar2;
  GLint GVar3;
  GLint GVar4;
  GLenum err;
  deUint32 dVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  ulong uVar7;
  TestError *pTVar8;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  int callNdx;
  GLuint GVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> intermediateResults;
  MessageBuilder local_1b0;
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  GVar3 = (*gl->getUniformLocation)((this->m_evenProgram->m_program).m_program,"u_callNdx");
  GVar4 = (*gl->getUniformLocation)((this->m_oddProgram->m_program).m_program,"u_callNdx");
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
  std::operator<<((ostream *)&local_1b0.m_str,"Running shader pair (even & odd) ");
  value = &this->m_numCalls;
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1b0,value);
  std::operator<<((ostream *)&pMVar6->m_str," times.\n");
  std::operator<<((ostream *)&pMVar6->m_str,"Num groups = (");
  value_00 = &this->m_workSize;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value_00);
  std::operator<<((ostream *)&pMVar6->m_str,", 1, 1)\n");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  if (GVar3 == -1) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"u_callNdx location was -1",
               (allocator<char> *)&intermediateResults);
    tcu::TestError::TestError(pTVar8,(string *)&local_1b0);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (GVar4 != -1) {
    (*gl->bindBufferBase)(0x90d2,1,this->m_intermediateResultBuffer);
    (*gl->bindBufferBase)(0x92c0,2,this->m_counterBuffer);
    for (GVar9 = 0; (int)GVar9 < *value; GVar9 = GVar9 + 1) {
      (*gl->useProgram)((this->m_evenProgram->m_program).m_program);
      (*gl->uniform1ui)(GVar3,GVar9);
      (*gl->dispatchCompute)(this->m_workSize,1,1);
      (*gl->useProgram)((this->m_oddProgram->m_program).m_program);
      (*gl->uniform1ui)(GVar4,GVar9);
      (*gl->dispatchCompute)(this->m_workSize,1,1);
    }
    err = (*gl->getError)();
    glu::checkError(err,"post dispatch",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x9c7);
    local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Verifying work buffer, it should be ");
    std::ostream::operator<<(poVar1,*value_00 * *value);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    GVar9 = this->m_counterBuffer;
    (*gl->bindBuffer)(0x92c0,GVar9);
    dVar5 = readBufferUint32(gl,GVar9);
    if (dVar5 == this->m_workSize * this->m_numCalls) {
      local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Counter buffer is valid.");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      intermediateResults.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      intermediateResults.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      intermediateResults.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Verifying intermediate results. ");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      (*gl->bindBuffer)(0x90d2,this->m_intermediateResultBuffer);
      readBuffer(gl,0x90d2,*value_00 * *value,&intermediateResults);
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (intermediateResults.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 intermediateResults.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      uVar10 = 0;
      uVar7 = (ulong)(uint)(*value * *value_00);
      if (*value * *value_00 < 1) {
        uVar7 = uVar10;
      }
      uVar12 = 0;
      for (; uVar7 * 4 + uVar10 != 0; uVar10 = uVar10 - 4) {
        if (uVar12 != intermediateResults.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12]) {
          local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = &local_1b0.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,"Intermediate buffer error, at value index ");
          std::ostream::operator<<(poVar1,(int)uVar12);
          std::operator<<((ostream *)poVar1,", expected ");
          std::ostream::operator<<(poVar1,(int)uVar12);
          std::operator<<((ostream *)poVar1,", got ");
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_1b0,
                              (uint *)((long)intermediateResults.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start - uVar10));
          std::operator<<((ostream *)&pMVar6->m_str,".\n");
          std::operator<<((ostream *)&pMVar6->m_str,
                          "Intermediate buffer contains invalid values. Intermediate results:\n");
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          poVar1 = &local_1b0.m_str;
          lVar11 = 0;
          for (lVar13 = 0; lVar13 < *value * *value_00; lVar13 = lVar13 + 1) {
            local_1b0.m_log =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            std::operator<<((ostream *)poVar1,"Value[");
            std::ostream::operator<<(poVar1,(int)lVar13);
            std::operator<<((ostream *)poVar1,"] = ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_1b0,
                                (uint *)((long)intermediateResults.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar11));
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
            lVar11 = lVar11 + 4;
          }
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Buffer contents invalid");
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&intermediateResults.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          return STOP;
        }
        uVar12 = uVar12 + 1;
      }
      local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Intermediate buffers are valid.");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&intermediateResults.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_1b0.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Counter buffer error, expected value ");
      std::ostream::operator<<(poVar1,*value_00 * *value);
      std::operator<<((ostream *)poVar1,", got ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"\n");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Buffer contents invalid";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(this_00,testResult,description);
    return STOP;
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"u_callNdx location was -1",
             (allocator<char> *)&intermediateResults);
  tcu::TestError::TestError(pTVar8,(string *)&local_1b0);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestCase::IterateResult ConcurrentAtomicCounterCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// invoke program N times, each with a different delta
	{
		const int evenCallNdxLocation	= gl.getUniformLocation(m_evenProgram->getProgram(), "u_callNdx");
		const int oddCallNdxLocation	= gl.getUniformLocation(m_oddProgram->getProgram(), "u_callNdx");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Running shader pair (even & odd) " << m_numCalls << " times.\n"
			<< "Num groups = (" << m_workSize << ", 1, 1)\n"
			<< tcu::TestLog::EndMessage;

		if (evenCallNdxLocation == -1)
			throw tcu::TestError("u_callNdx location was -1");
		if (oddCallNdxLocation == -1)
			throw tcu::TestError("u_callNdx location was -1");

		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_intermediateResultBuffer);
		gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 2, m_counterBuffer);

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			gl.useProgram(m_evenProgram->getProgram());
			gl.uniform1ui(evenCallNdxLocation, (deUint32)callNdx);
			gl.dispatchCompute(m_workSize, 1, 1);

			gl.useProgram(m_oddProgram->getProgram());
			gl.uniform1ui(oddCallNdxLocation, (deUint32)callNdx);
			gl.dispatchCompute(m_workSize, 1, 1);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "post dispatch");
	}

	// Verify result
	{
		deUint32 result;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying work buffer, it should be " << m_numCalls*m_workSize << tcu::TestLog::EndMessage;

		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counterBuffer);
		result = readBufferUint32(gl, GL_ATOMIC_COUNTER_BUFFER);

		if ((int)result != m_numCalls*m_workSize)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Counter buffer error, expected value " << (m_numCalls*m_workSize) << ", got " << result << "\n"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
			return STOP;
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Counter buffer is valid." << tcu::TestLog::EndMessage;
	}

	// verify steps
	{
		std::vector<deUint32> intermediateResults;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying intermediate results. " << tcu::TestLog::EndMessage;

		// collect results

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffer);
		readBuffer(gl, GL_SHADER_STORAGE_BUFFER, m_numCalls * m_workSize, intermediateResults);

		// verify values

		std::sort(intermediateResults.begin(), intermediateResults.end());

		for (int valueNdx = 0; valueNdx < m_workSize * m_numCalls; ++valueNdx)
		{
			if ((int)intermediateResults[valueNdx] != valueNdx)
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Intermediate buffer error, at value index " << valueNdx << ", expected " << valueNdx << ", got " << intermediateResults[valueNdx] << ".\n"
					<< "Intermediate buffer contains invalid values. Intermediate results:\n"
					<< tcu::TestLog::EndMessage;

				for (int logCallNdx = 0; logCallNdx < m_workSize * m_numCalls; ++logCallNdx)
					m_testCtx.getLog() << tcu::TestLog::Message << "Value[" << logCallNdx << "] = " << intermediateResults[logCallNdx] << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Intermediate buffers are valid." << tcu::TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}